

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

uint8_t phosg::value_for_hex_char(char x)

{
  out_of_range *this;
  string local_30;
  char local_a;
  uint8_t local_9;
  char x_local;
  
  if ((x < '0') || ('9' < x)) {
    if ((x < 'A') || ('F' < x)) {
      if ((x < 'a') || ('f' < x)) {
        local_a = x;
        this = (out_of_range *)__cxa_allocate_exception(0x10);
        string_printf_abi_cxx11_(&local_30,"invalid hex char: %c",(ulong)(uint)(int)local_a);
        ::std::out_of_range::out_of_range(this,(string *)&local_30);
        __cxa_throw(this,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
      }
      local_9 = x + 0xa9;
    }
    else {
      local_9 = x + 0xc9;
    }
  }
  else {
    local_9 = x + 0xd0;
  }
  return local_9;
}

Assistant:

uint8_t value_for_hex_char(char x) {
  if (x >= '0' && x <= '9') {
    return x - '0';
  }
  if (x >= 'A' && x <= 'F') {
    return (x - 'A') + 0xA;
  }
  if (x >= 'a' && x <= 'f') {
    return (x - 'a') + 0xA;
  }
  throw out_of_range(string_printf("invalid hex char: %c", x));
}